

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

char * gl4cts::anon_unknown_0::GetInputUBO1
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data)

{
  reference pvVar1;
  float *fp_1;
  float *fp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data,0x30);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data,0);
  pvVar1[0] = '\0';
  pvVar1[1] = '\0';
  pvVar1[2] = 0x80;
  pvVar1[3] = '?';
  pvVar1[4] = '\0';
  pvVar1[5] = '\0';
  pvVar1[6] = '\0';
  pvVar1[7] = '\0';
  pvVar1[8] = '\0';
  pvVar1[9] = '\0';
  pvVar1[10] = '\0';
  pvVar1[0xb] = '\0';
  pvVar1[0xc] = '\0';
  pvVar1[0xd] = '\0';
  pvVar1[0xe] = '\0';
  pvVar1[0xf] = '\0';
  pvVar1[0x10] = '\0';
  pvVar1[0x11] = '\0';
  pvVar1[0x12] = '\0';
  pvVar1[0x13] = '@';
  pvVar1[0x14] = '\0';
  pvVar1[0x15] = '\0';
  pvVar1[0x16] = '\0';
  pvVar1[0x17] = '\0';
  pvVar1[0x18] = '\0';
  pvVar1[0x19] = '\0';
  pvVar1[0x1a] = '\0';
  pvVar1[0x1b] = '\0';
  pvVar1[0x1c] = '\0';
  pvVar1[0x1d] = '\0';
  pvVar1[0x1e] = '\0';
  pvVar1[0x1f] = '\0';
  pvVar1[0x20] = '\0';
  pvVar1[0x21] = '\0';
  pvVar1[0x22] = '@';
  pvVar1[0x23] = '@';
  pvVar1[0x24] = '\0';
  pvVar1[0x25] = '\0';
  pvVar1[0x26] = '\0';
  pvVar1[0x27] = '\0';
  pvVar1[0x28] = '\0';
  pvVar1[0x29] = '\0';
  pvVar1[0x2a] = '\0';
  pvVar1[0x2b] = '\0';
  pvVar1[0x2c] = '\0';
  pvVar1[0x2d] = '\0';
  pvVar1[0x2e] = '\0';
  pvVar1[0x2f] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data + 1,0xc);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data + 1,0);
  pvVar1[0] = '\0';
  pvVar1[1] = '\0';
  pvVar1[2] = 0x80;
  pvVar1[3] = '?';
  pvVar1[4] = '\0';
  pvVar1[5] = '\0';
  pvVar1[6] = '\0';
  pvVar1[7] = '@';
  pvVar1[8] = '\0';
  pvVar1[9] = '\0';
  pvVar1[10] = '@';
  pvVar1[0xb] = '@';
  return 
  "\nlayout(std140, binding = 0) uniform InputUBO {\n  float data0;\n  float data1[2];\n} g_input_ubo;\nlayout(std430, binding = 0) buffer InputSSBO {\n  float data0;\n  float data1[2];\n} g_input_ssbo;\nlayout(std140, binding = 1) buffer OutputUBO {\n  float data0;\n  float data1[2];\n} g_output_ubo;\nlayout(std430, binding = 2) buffer OutputSSBO {\n  float data0;\n  float data1[2];\n} g_output_ssbo;\nvoid main() {\n  g_output_ubo.data0 = g_input_ubo.data0;\n  for (int i = 0; i < g_input_ubo.data1.length(); ++i) g_output_ubo.data1[i] = g_input_ubo.data1[i];\n  g_output_ssbo.data0 = g_input_ssbo.data0;\n  for (int i = 0; i < g_input_ssbo.data1.length(); ++i) g_output_ssbo.data1[i] = g_input_ssbo.data1[i];\n}"
  ;
}

Assistant:

const char* GetInputUBO1(std::vector<GLubyte> in_data[2])
{
	/* UBO */
	{
		in_data[0].resize(12 * 4);
		float* fp = reinterpret_cast<float*>(&in_data[0][0]);
		fp[0]	 = 1.0f;
		fp[1]	 = 0.0f;
		fp[2]	 = 0.0f;
		fp[3]	 = 0.0f;
		fp[4]	 = 2.0f;
		fp[5]	 = 0.0f;
		fp[6]	 = 0.0f;
		fp[7]	 = 0.0f;
		fp[8]	 = 3.0f;
		fp[9]	 = 0.0f;
		fp[10]	= 0.0f;
		fp[11]	= 0.0f;
	}
	/* SSBO */
	{
		in_data[1].resize(3 * 4);
		float* fp = reinterpret_cast<float*>(&in_data[1][0]);
		fp[0]	 = 1.0f;
		fp[1]	 = 2.0f;
		fp[2]	 = 3.0f;
	}
	return NL
		"layout(std140, binding = 0) uniform InputUBO {" NL "  float data0;" NL "  float data1[2];" NL
		"} g_input_ubo;" NL "layout(std430, binding = 0) buffer InputSSBO {" NL "  float data0;" NL
		"  float data1[2];" NL "} g_input_ssbo;" NL "layout(std140, binding = 1) buffer OutputUBO {" NL
		"  float data0;" NL "  float data1[2];" NL "} g_output_ubo;" NL
		"layout(std430, binding = 2) buffer OutputSSBO {" NL "  float data0;" NL "  float data1[2];" NL
		"} g_output_ssbo;" NL "void main() {" NL "  g_output_ubo.data0 = g_input_ubo.data0;" NL
		"  for (int i = 0; i < g_input_ubo.data1.length(); ++i) g_output_ubo.data1[i] = g_input_ubo.data1[i];" NL
		"  g_output_ssbo.data0 = g_input_ssbo.data0;" NL
		"  for (int i = 0; i < g_input_ssbo.data1.length(); ++i) g_output_ssbo.data1[i] = g_input_ssbo.data1[i];" NL
		"}";
}